

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

word Extra_TruthCanonNPN3(word uTruth,int nVars,Vec_Wrd_t *vRes)

{
  word wVar1;
  int iVar2;
  int *__ptr;
  int *__ptr_00;
  ulong local_70;
  int local_64;
  int local_60;
  int c;
  int p;
  int i;
  word uTruthMin;
  word tTemp2;
  word tTemp1;
  word tCur;
  int *pPerm;
  int *pComp;
  int nPerms;
  int nMints;
  Vec_Wrd_t *vRes_local;
  int nVars_local;
  word uTruth_local;
  
  iVar2 = Extra_Factorial(nVars);
  __ptr = Extra_GreyCodeSchedule(nVars);
  __ptr_00 = Extra_PermSchedule(nVars);
  _p = 0xffffffffffffffff;
  Vec_WrdClear(vRes);
  c = 0;
  do {
    if (1 < c) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (int *)0x0) {
        free(__ptr_00);
      }
      return _p;
    }
    local_70 = uTruth;
    if (c != 0) {
      local_70 = uTruth ^ 0xffffffffffffffff;
    }
    tTemp1 = local_70;
    for (local_60 = 0; wVar1 = tTemp1, local_60 < iVar2; local_60 = local_60 + 1) {
      for (local_64 = 0; local_64 < 1 << ((byte)nVars & 0x1f); local_64 = local_64 + 1) {
        if (tTemp1 < _p) {
          _p = tTemp1;
        }
        Vec_WrdPushUnique(vRes,tTemp1);
        tTemp1 = Abc_Tt6Flip(tTemp1,__ptr[local_64]);
      }
      if (wVar1 != tTemp1) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                      ,0xb9,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
      }
      tTemp1 = Abc_Tt6SwapAdjacent(tTemp1,__ptr_00[local_60]);
    }
    if (local_70 != tTemp1) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                    ,0xbc,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
    }
    c = c + 1;
  } while( true );
}

Assistant:

word Extra_TruthCanonNPN3( word uTruth, int nVars, Vec_Wrd_t * vRes )
{
    int nMints  = (1 << nVars);
    int nPerms  = Extra_Factorial( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    int * pPerm = Extra_PermSchedule( nVars );
    word tCur, tTemp1, tTemp2;
    word uTruthMin = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    int i, p, c;
    Vec_WrdClear( vRes );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( uTruthMin > tCur )
                    uTruthMin = tCur;
                Vec_WrdPushUnique( vRes, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    return uTruthMin;
}